

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * cuddZddSubset1(DdManager *dd,DdNode *P,int var)

{
  DdNode *zvar_00;
  DdNode *empty;
  DdNode *base;
  DdNode *r;
  DdNode *zvar;
  int var_local;
  DdNode *P_local;
  DdManager *dd_local;
  
  zvar_00 = cuddUniqueInterZdd(dd,var,dd->one,dd->zero);
  if (zvar_00 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)zvar_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)zvar_00 & 0xfffffffffffffffe) + 4) + 1;
    dd_local = (DdManager *)zdd_subset1_aux(dd,P,zvar_00);
    if (dd_local == (DdManager *)0x0) {
      Cudd_RecursiveDerefZdd(dd,zvar_00);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDerefZdd(dd,zvar_00);
      *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddZddSubset1(
  DdManager * dd,
  DdNode * P,
  int  var)
{
    DdNode      *zvar, *r;
    DdNode      *base, *empty;

    base = DD_ONE(dd);
    empty = DD_ZERO(dd);

    zvar = cuddUniqueInterZdd(dd, var, base, empty);
    if (zvar == NULL) {
        return(NULL);
    } else {
        cuddRef(zvar);
        r = zdd_subset1_aux(dd, P, zvar);
        if (r == NULL) {
            Cudd_RecursiveDerefZdd(dd, zvar);
            return(NULL);
        }
        cuddRef(r);
        Cudd_RecursiveDerefZdd(dd, zvar);
    }

    cuddDeref(r);
    return(r);

}